

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

char * vkb::to_string(PhysicalDeviceError err)

{
  if (err < 4) {
    return (&PTR_anon_var_dwarf_50dbd_00122d00)[err];
  }
  return "";
}

Assistant:

const char* to_string(PhysicalDeviceError err) {
    switch (err) {
        CASE_TO_STRING(PhysicalDeviceError, no_surface_provided)
        CASE_TO_STRING(PhysicalDeviceError, failed_enumerate_physical_devices)
        CASE_TO_STRING(PhysicalDeviceError, no_physical_devices_found)
        CASE_TO_STRING(PhysicalDeviceError, no_suitable_device)
        default:
            return "";
    }
}